

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void ensure_ev_owned(CManager_conflict cm,event_item *event)

{
  CManager_conflict in_RSI;
  event_item *in_stack_ffffffffffffffe8;
  
  if ((in_RSI->initialized == 0) && (in_RSI->pbio_requests == (_pending_format_requests *)0x0)) {
    encode_event(in_RSI,in_stack_ffffffffffffffe8);
    in_RSI->control_list = (CMControlList)0x0;
    *(undefined4 *)((long)&in_RSI->transports + 4) = 1;
    in_RSI->initialized = 2;
    if (in_RSI->control_module_choice == (char *)0x0) {
      __assert_fail("event->encoded_event",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                    ,0x3bb,"void ensure_ev_owned(CManager, event_item *)");
    }
  }
  return;
}

Assistant:

extern void 
ensure_ev_owned(CManager cm, event_item *event)
{
    if (event->contents == Event_App_Owned && !event->free_func) {
        encode_event(cm, event);
        event->decoded_event = NULL;
        event->event_encoded = 1;
        event->contents = Event_CM_Owned;
        assert(event->encoded_event);
    }
}